

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

int * Extra_SupportArray(DdManager *dd,DdNode *f,int *support)

{
  int local_2c;
  int local_24;
  int size;
  int i;
  int *support_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (dd->size < dd->sizeZ) {
    local_2c = dd->sizeZ;
  }
  else {
    local_2c = dd->size;
  }
  for (local_24 = 0; local_24 < local_2c; local_24 = local_24 + 1) {
    support[local_24] = 0;
  }
  ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),support);
  ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
  return support;
}

Assistant:

int * 
Extra_SupportArray(
  DdManager * dd, /* manager */
  DdNode * f,     /* DD whose support is sought */
  int * support ) /* array allocated by the user */
{
    int i, size;

    /* Initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    for (i = 0; i < size; i++) 
        support[i] = 0;
    
    /* Compute support and clean up markers. */
    ddSupportStep(Cudd_Regular(f),support);
    ddClearFlag(Cudd_Regular(f));

    return(support);

}